

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_erasure.cpp
# Opt level: O2

void __thiscall Drawable::Drawable<Square,void>(Drawable *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  element_type *local_18;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_10;
  
  std::make_shared<Square,Square&>((Square *)&local_18);
  _Var1._M_pi = _Stack_10._M_pi;
  _Stack_10._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->ptr).super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_18;
  (this->ptr).super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var1._M_pi;
  local_18 = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_10);
  *(undefined8 *)((long)&(this->draw).super__Function_base._M_functor + 8) = 0;
  *(Drawable **)&(this->draw).super__Function_base._M_functor = this;
  (this->draw)._M_invoker =
       std::
       _Function_handler<void_(std::basic_ostream<char,_std::char_traits<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/polymorphism/type_erasure.cpp:21:53)>
       ::_M_invoke;
  (this->draw).super__Function_base._M_manager =
       std::
       _Function_handler<void_(std::basic_ostream<char,_std::char_traits<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/polymorphism/type_erasure.cpp:21:53)>
       ::_M_manager;
  return;
}

Assistant:

Drawable(T t) : ptr{std::make_shared<T>(t)}, draw{[this](auto&... args) { static_cast<T*>(ptr.get())->draw(args...); }} {}